

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<VkSpecParser::Command>::emplace<VkSpecParser::Command_const&>
          (QGenericArrayOps<VkSpecParser::Command> *this,qsizetype i,Command *args)

{
  Command **ppCVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_e8;
  Command tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QArrayDataPointer<VkSpecParser::Command>).d;
  if ((pDVar4 != (Data *)0x0) &&
     ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if ((this->super_QArrayDataPointer<VkSpecParser::Command>).size == i) {
      qVar5 = QArrayDataPointer<VkSpecParser::Command>::freeSpaceAtEnd
                        (&this->super_QArrayDataPointer<VkSpecParser::Command>);
      if (qVar5 == 0) goto LAB_00107c7d;
      VkSpecParser::Command::Command
                ((this->super_QArrayDataPointer<VkSpecParser::Command>).ptr +
                 (this->super_QArrayDataPointer<VkSpecParser::Command>).size,args);
LAB_00107da8:
      pqVar2 = &(this->super_QArrayDataPointer<VkSpecParser::Command>).size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00107d61;
    }
LAB_00107c7d:
    if (i == 0) {
      qVar5 = QArrayDataPointer<VkSpecParser::Command>::freeSpaceAtBegin
                        (&this->super_QArrayDataPointer<VkSpecParser::Command>);
      if (qVar5 != 0) {
        VkSpecParser::Command::Command
                  ((this->super_QArrayDataPointer<VkSpecParser::Command>).ptr + -1,args);
        ppCVar1 = &(this->super_QArrayDataPointer<VkSpecParser::Command>).ptr;
        *ppCVar1 = *ppCVar1 + -1;
        goto LAB_00107da8;
      }
    }
  }
  tmp.deviceLevel = true;
  tmp._97_7_ = 0xaaaaaaaaaaaaaa;
  tmp.args.d.ptr = (TypedName *)0xaaaaaaaaaaaaaaaa;
  tmp.args.d.size = -0x5555555555555556;
  tmp.cmd.typeSuffix.d.size = -0x5555555555555556;
  tmp.args.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  tmp.cmd.typeSuffix.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  tmp.cmd.typeSuffix.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  tmp.cmd.type.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  tmp.cmd.type.d.size = -0x5555555555555556;
  tmp.cmd.name.d.size = -0x5555555555555556;
  tmp.cmd.type.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  tmp.cmd.name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  tmp.cmd.name.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  VkSpecParser::Command::Command(&tmp,args);
  bVar6 = (this->super_QArrayDataPointer<VkSpecParser::Command>).size != 0;
  QArrayDataPointer<VkSpecParser::Command>::detachAndGrow
            (&this->super_QArrayDataPointer<VkSpecParser::Command>,(uint)(i == 0 && bVar6),1,
             (Command **)0x0,(QArrayDataPointer<VkSpecParser::Command> *)0x0);
  if (i == 0 && bVar6) {
    VkSpecParser::Command::Command
              ((this->super_QArrayDataPointer<VkSpecParser::Command>).ptr + -1,&tmp);
    ppCVar1 = &(this->super_QArrayDataPointer<VkSpecParser::Command>).ptr;
    *ppCVar1 = *ppCVar1 + -1;
    pqVar2 = &(this->super_QArrayDataPointer<VkSpecParser::Command>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    local_e8.sourceCopyConstruct = 0;
    local_e8.nSource = 0;
    local_e8.move = 0;
    local_e8.sourceCopyAssign = 0;
    local_e8.end = (Command *)0x0;
    local_e8.last = (Command *)0x0;
    local_e8.where = (Command *)0x0;
    local_e8.begin = (this->super_QArrayDataPointer<VkSpecParser::Command>).ptr;
    local_e8.size = (this->super_QArrayDataPointer<VkSpecParser::Command>).size;
    local_e8.data = &this->super_QArrayDataPointer<VkSpecParser::Command>;
    Inserter::insertOne(&local_e8,i,&tmp);
    (local_e8.data)->ptr = local_e8.begin;
    (local_e8.data)->size = local_e8.size;
  }
  VkSpecParser::Command::~Command(&tmp);
LAB_00107d61:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }